

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall ON_MeshTopology::TopVertexIsHidden(ON_MeshTopology *this,int topvi)

{
  ON_Mesh *pOVar1;
  ON_MeshTopologyVertex *pOVar2;
  bool bVar3;
  bool *pbVar4;
  ulong uVar5;
  ulong uVar6;
  
  pOVar1 = this->m_mesh;
  if (((pOVar1 == (ON_Mesh *)0x0) || (pOVar1->m_hidden_count < 1)) ||
     ((pOVar1->m_H).m_count != (pOVar1->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count)) {
    pbVar4 = (bool *)0x0;
  }
  else {
    pbVar4 = (pOVar1->m_H).m_a;
  }
  bVar3 = false;
  if (((-1 < topvi) && (bVar3 = false, pbVar4 != (bool *)0x0)) && (topvi < (this->m_topv).m_count))
  {
    pOVar2 = (this->m_topv).m_a;
    uVar5 = (ulong)pOVar2[(uint)topvi].m_v_count;
    bVar3 = (long)uVar5 < 1;
    if (0 < (long)uVar5) {
      uVar6 = 0;
      do {
        if (pbVar4[pOVar2[(uint)topvi].m_vi[uVar6]] == false) {
          return false;
        }
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
      bVar3 = uVar5 <= uVar6;
    }
  }
  return bVar3;
}

Assistant:

bool ON_MeshTopology::TopVertexIsHidden( int topvi ) const
{
  const bool* bHiddenVertex = m_mesh ? m_mesh->HiddenVertexArray() : 0;
  if ( bHiddenVertex && topvi >= 0 && topvi < m_topv.Count() )
  {
    const ON_MeshTopologyVertex& topv = m_topv[topvi];
    int i;
    for ( i = 0; i < topv.m_v_count; i++ )
    {
      if ( !bHiddenVertex[topv.m_vi[i]] )
        return false;
    }
    return true;
  }
  return false;
}